

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

string * __thiscall
perfetto::ipc::BufferedFrameDeserializer::Serialize_abi_cxx11_
          (string *__return_storage_ptr__,BufferedFrameDeserializer *this,Frame *frame)

{
  int iVar1;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> payload;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  (**(code **)((this->buf_).p_ + 0x18))(&local_30);
  iVar2 = (int)local_30._M_impl.super__Vector_impl_data._M_start;
  iVar1 = (int)local_30._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  *(int *)(__return_storage_ptr__->_M_dataplus)._M_p = iVar1 - iVar2;
  memcpy((__return_storage_ptr__->_M_dataplus)._M_p + 4,
         local_30._M_impl.super__Vector_impl_data._M_start,
         (long)local_30._M_impl.super__Vector_impl_data._M_finish -
         (long)local_30._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string BufferedFrameDeserializer::Serialize(const Frame& frame) {
  std::vector<uint8_t> payload = frame.SerializeAsArray();
  const uint32_t payload_size = static_cast<uint32_t>(payload.size());
  std::string buf;
  buf.resize(kHeaderSize + payload_size);
  memcpy(&buf[0], base::AssumeLittleEndian(&payload_size), kHeaderSize);
  memcpy(&buf[kHeaderSize], payload.data(), payload.size());
  return buf;
}